

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocale.h
# Opt level: O0

void __thiscall cmLocaleRAII::~cmLocaleRAII(cmLocaleRAII *this)

{
  char *__locale;
  cmLocaleRAII *this_local;
  
  __locale = (char *)std::__cxx11::string::c_str();
  setlocale(0,__locale);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~cmLocaleRAII() { setlocale(LC_CTYPE, this->OldLocale.c_str()); }